

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::SetCurrentBinaryDirectory(cmMakefile *this,string *dir)

{
  allocator local_41;
  string local_40;
  char *local_20;
  char *binDir;
  string *dir_local;
  cmMakefile *this_local;
  
  binDir = (char *)dir;
  dir_local = (string *)this;
  cmState::Snapshot::SetCurrentBinaryDirectory(&this->StateSnapshot,dir);
  local_20 = cmState::Snapshot::GetCurrentBinaryDirectory(&this->StateSnapshot);
  cmsys::SystemTools::MakeDirectory(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"CMAKE_CURRENT_BINARY_DIR",&local_41);
  AddDefinition(this,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void cmMakefile::SetCurrentBinaryDirectory(const std::string& dir)
{
  this->StateSnapshot.SetCurrentBinaryDirectory(dir);
  const char* binDir = this->StateSnapshot.GetCurrentBinaryDirectory();
  cmSystemTools::MakeDirectory(binDir);
  this->AddDefinition("CMAKE_CURRENT_BINARY_DIR", binDir);
}